

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O1

QBitArray * sizedForOverwrite(QBitArray *__return_storage_ptr__,QBitArray *a1,QBitArray *a2)

{
  char cVar1;
  long lVar2;
  char cVar3;
  long capacity;
  long lVar4;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<char> local_58;
  QArrayData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d.d = (Data *)0x0;
  (__return_storage_ptr__->d).d.ptr = (char *)0x0;
  (__return_storage_ptr__->d).d.size = 0;
  lVar4 = (a1->d).d.size;
  lVar2 = (a2->d).d.size;
  capacity = lVar2;
  if (lVar2 < lVar4) {
    capacity = lVar4;
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char *)QArrayData::allocate1(&local_40,capacity,KeepSize);
  local_58.d = (Data *)local_40;
  if (lVar2 < lVar4) {
    cVar3 = *(a1->d).d.ptr;
  }
  else if (lVar4 < lVar2) {
    lVar4 = lVar2;
    cVar3 = *(a2->d).d.ptr;
  }
  else {
    if (lVar4 == 0) goto LAB_0035bd09;
    cVar1 = *(a1->d).d.ptr;
    cVar3 = *(a2->d).d.ptr;
    if (cVar1 < cVar3) {
      cVar3 = cVar1;
    }
  }
  *local_58.ptr = cVar3;
  local_58.ptr[lVar4] = '\0';
LAB_0035bd09:
  local_58.size = capacity;
  QArrayDataPointer<char>::operator=((QArrayDataPointer<char> *)__return_storage_ptr__,&local_58);
  if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QBitArray sizedForOverwrite(const QBitArray &a1, const QBitArray &a2)
{
    QBitArray result;
    const QByteArrayData &d1 = a1.data_ptr();
    const QByteArrayData &d2 = a2.data_ptr();
    qsizetype n1 = d1.size;
    qsizetype n2 = d2.size;
    qsizetype n = qMax(n1, n2);

    QByteArrayData bytes(n, n);

    // initialize the count of bits in the last byte (see construction note)
    // and the QByteArray null termination (some of our algorithms read it)
    if (n1 > n2) {
        *bytes.ptr = *d1.ptr;
        bytes.ptr[n1] = 0;
    } else if (n2 > n1) {
        *bytes.ptr = *d2.ptr;
        bytes.ptr[n2] = 0;
    } else if (n1) {    // n1 == n2
        *bytes.ptr = qMin(*d1.ptr, *d2.ptr);
        bytes.ptr[n1] = 0;
    }

    result.data_ptr() = std::move(bytes);
    return result;
}